

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

char * __thiscall
Fossilize::ConcurrentDatabase::get_db_path_for_hash
          (ConcurrentDatabase *this,ResourceTag tag,Hash hash)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  unique_ptr *this_00;
  pointer pDVar4;
  undefined4 extraout_var_00;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *extra;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
  *__range2;
  Hash hash_local;
  ResourceTag tag_local;
  ConcurrentDatabase *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->readonly_interface);
  if (bVar1) {
    pDVar4 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->(&this->readonly_interface);
    uVar2 = (*pDVar4->_vptr_DatabaseInterface[5])(pDVar4,(ulong)tag,hash);
    if ((uVar2 & 1) != 0) {
      pDVar4 = std::
               unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ::operator->(&this->readonly_interface);
      iVar3 = (*pDVar4->_vptr_DatabaseInterface[8])(pDVar4,(ulong)tag,hash);
      return (char *)CONCAT44(extraout_var,iVar3);
    }
  }
  __end2 = std::
           vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
           ::begin(&this->extra_readonly);
  extra = (unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           *)std::
             vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
             ::end(&this->extra_readonly);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
                                *)&extra);
    if (!bVar1) {
      return (char *)0x0;
    }
    this_00 = (unique_ptr *)
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
              ::operator*(&__end2);
    bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      pDVar4 = std::
               unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                             *)this_00);
      uVar2 = (*pDVar4->_vptr_DatabaseInterface[5])(pDVar4,(ulong)tag,hash);
      if ((uVar2 & 1) != 0) {
        pDVar4 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                               *)this_00);
        iVar3 = (*pDVar4->_vptr_DatabaseInterface[8])(pDVar4,(ulong)tag,hash);
        return (char *)CONCAT44(extraout_var_00,iVar3);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

const char *get_db_path_for_hash(ResourceTag tag, Hash hash) override
	{
		if (readonly_interface && readonly_interface->has_entry(tag, hash))
			return readonly_interface->get_db_path_for_hash(tag, hash);

		for (auto &extra : extra_readonly)
		{
			if (extra && extra->has_entry(tag, hash))
				return extra->get_db_path_for_hash(tag, hash);
		}

		return nullptr;
	}